

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaNormLen(xmlChar *value)

{
  byte *pbVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  
  if (value == (xmlChar *)0x0) {
LAB_001a5773:
    iVar2 = -1;
  }
  else {
    while ((uVar4 = (ulong)*value, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
      value = value + 1;
    }
    iVar2 = 0;
    while( true ) {
      bVar3 = (byte)uVar4;
      if (bVar3 == 0) break;
      if ((char)bVar3 < '\0') goto LAB_001a5773;
      if ((bVar3 < 0x21) && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0)) {
        while ((byte)uVar4 < 0x21) {
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
            if (uVar4 == 0) {
              return iVar2;
            }
            break;
          }
          pbVar1 = value + 1;
          value = value + 1;
          uVar4 = (ulong)*pbVar1;
        }
      }
      else {
        value = value + 1;
      }
      iVar2 = iVar2 + 1;
      uVar4 = (ulong)*value;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaNormLen(const xmlChar *value) {
    const xmlChar *utf;
    int ret = 0;

    if (value == NULL)
	return(-1);
    utf = value;
    while (IS_BLANK_CH(*utf)) utf++;
    while (*utf != 0) {
	if (utf[0] & 0x80) {
	    if ((utf[1] & 0xc0) != 0x80)
		return(-1);
	    if ((utf[0] & 0xe0) == 0xe0) {
		if ((utf[2] & 0xc0) != 0x80)
		    return(-1);
		if ((utf[0] & 0xf0) == 0xf0) {
		    if ((utf[0] & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
			return(-1);
		    utf += 4;
		} else {
		    utf += 3;
		}
	    } else {
		utf += 2;
	    }
	} else if (IS_BLANK_CH(*utf)) {
	    while (IS_BLANK_CH(*utf)) utf++;
	    if (*utf == 0)
		break;
	} else {
	    utf++;
	}
	ret++;
    }
    return(ret);
}